

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O3

void * cppcms::impl::mmap_anonymous(size_t size)

{
  int err;
  void *pvVar1;
  int *piVar2;
  cppcms_error *this;
  string local_48;
  
  pvVar1 = mmap((void *)0x0,size,3,0x21,-1,0);
  piVar2 = __errno_location();
  if (pvVar1 != (void *)0xffffffffffffffff) {
    return pvVar1;
  }
  err = *piVar2;
  this = (cppcms_error *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Failed to create shared memory","");
  cppcms_error::cppcms_error(this,err,&local_48);
  __cxa_throw(this,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

inline void *mmap_anonymous(size_t size)
	{
		#if defined(MAP_ANONYMOUS)
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE, MAP_ANONYMOUS | MAP_SHARED, -1, 0);
		int err=errno;
		#elif defined(MAP_ANON)
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE, MAP_ANON | MAP_SHARED, -1, 0);
		int err=errno;
		#else
		int fd=::open("/dev/null",O_RDWR);
		if(fd < 0) 
			throw cppcms_error(errno,"Failed to open /dev/null");
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE,MAP_SHARED, fd, 0);
		int err=errno;
		::close(fd);
		#endif
		if(p==MAP_FAILED)
			throw cppcms_error(err,"Failed to create shared memory");
		return p;
	}